

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O3

ArrayOrdering adios2_ToArrayOrdering(adios2_arrayordering Corder)

{
  ArrayOrdering AVar1;
  
  AVar1 = (Corder != adios2_arrayordering_columnmajor) + ColumnMajor;
  if (Corder == adios2_arrayordering_rowmajor) {
    AVar1 = RowMajor;
  }
  return AVar1;
}

Assistant:

adios2::ArrayOrdering adios2_ToArrayOrdering(const adios2_arrayordering Corder)
{
    adios2::ArrayOrdering order = adios2::ArrayOrdering::Auto;
    switch (Corder)
    {

    case adios2_arrayordering_rowmajor:
        order = adios2::ArrayOrdering::RowMajor;
        break;

    case adios2_arrayordering_columnmajor:
        order = adios2::ArrayOrdering::ColumnMajor;
        break;

    case adios2_arrayordering_auto:
        order = adios2::ArrayOrdering::Auto;
        break;

    default:
        break;
    }
    return order;
}